

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsapp.cc
# Opt level: O3

int __thiscall
FrobTadsApplication::fRunTads3
          (FrobTadsApplication *this,char *filename,int argc,char **argv,char *savedState,
          TadsNetConfig *netconfig)

{
  int iVar1;
  CVmHostIfcStdio *this_00;
  CVmMainClientConsole clientifc;
  CVmMainClientIfc local_d0;
  vm_run_image_params local_c8;
  
  local_d0._vptr_CVmMainClientIfc = (_func_int **)&PTR__CVmMainClientIfc_00349750;
  this_00 = (CVmHostIfcStdio *)operator_new(0x50);
  CVmHostIfcStdio::CVmHostIfcStdio(this_00,"");
  (*(this_00->super_CVmHostIfcText).super_CVmHostIfc._vptr_CVmHostIfc[4])
            (this_00,(ulong)(uint)(this->options).safetyLevelR,
             (ulong)(uint)(this->options).safetyLevelW);
  (*(this_00->super_CVmHostIfcText).super_CVmHostIfc._vptr_CVmHostIfc[6])
            (this_00,(ulong)(uint)(this->options).netSafetyLevelC,
             (ulong)(uint)(this->options).netSafetyLevelS);
  local_c8.clientifc = &local_d0;
  local_c8.script_quiet = 0;
  local_c8.log_file = (char *)0x0;
  local_c8.more_mode = 1;
  local_c8.load_from_exe = 0;
  local_c8.show_banner = 0;
  local_c8.charset = (char *)0x0;
  local_c8.log_charset = (char *)0x0;
  local_c8.res_dir = (char *)0x0;
  local_c8.file_dir = (char *)0x0;
  local_c8.sandbox_dir = (char *)0x0;
  local_c8.timezone = (char *)0x0;
  local_c8.script_file = (this->options).replayFile._M_dataplus._M_p;
  local_c8.seed_rand = (this->options).seedRand;
  local_c8.cmd_log_file = (this->options).cmdLogFile._M_dataplus._M_p;
  local_c8.hostifc = (CVmHostIfc *)this_00;
  local_c8.image_file_name = filename;
  local_c8.prog_argv = argv;
  local_c8.prog_argc = argc;
  local_c8.saved_state = savedState;
  local_c8.netconfig = netconfig;
  iVar1 = vm_run_image(&local_c8);
  (*(this_00->super_CVmHostIfcText).super_CVmHostIfc._vptr_CVmHostIfc[1])(this_00);
  return iVar1;
}

Assistant:

int
FrobTadsApplication::fRunTads3( char* filename, int argc, const char* const* argv,
                                const char *savedState, class TadsNetConfig* netconfig )
{
    // Create the Tads 3 host and client services interfaces.
    CVmMainClientConsole clientifc;
    const auto hostifc = std::make_unique<CVmHostIfcStdio>("");

    // Set the file I/O safety level.
    hostifc->set_io_safety(this->options.safetyLevelR, this->options.safetyLevelW);

    // Set the network safety level.
    hostifc->set_net_safety(this->options.netSafetyLevelC, this->options.netSafetyLevelS);

    // Set up the VM/program parameters.
    vm_run_image_params params(&clientifc, hostifc.get(), filename);
    params.prog_argv = argv;
    params.prog_argc = argc;
    params.script_file = this->options.replayFile.c_str();
    params.seed_rand = this->options.seedRand;
    params.saved_state = savedState;
    params.netconfig = netconfig;
    params.cmd_log_file = this->options.cmdLogFile.c_str();

    // Invoke the VM to run the program.
    int vmRet = vm_run_image(&params);

    // Return the result from the VM ivocation.
    return vmRet;
}